

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_fma.cpp
# Opt level: O3

int __thiscall ncnn::Convolution_x86_fma::create_pipeline(Convolution_x86_fma *this,Option *opt)

{
  int *piVar1;
  size_t sVar2;
  size_t sVar3;
  _func_int *p_Var4;
  long *plVar5;
  undefined1 auVar6 [16];
  undefined8 uVar7;
  byte bVar8;
  bool bVar9;
  bool bVar10;
  byte bVar11;
  int k_6;
  uint num_input;
  int iVar12;
  undefined4 uVar13;
  _func_int **pp_Var14;
  Layer *pLVar15;
  undefined4 *puVar16;
  long lVar17;
  long lVar18;
  byte bVar19;
  int iVar20;
  _func_int **pp_Var21;
  void *pvVar22;
  undefined4 *puVar23;
  int k_4;
  int iVar24;
  uint uVar25;
  uint uVar26;
  undefined4 *puVar27;
  _func_int **pp_Var28;
  _func_int **pp_Var29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  _func_int *p_Var34;
  long lVar35;
  int k;
  uint uVar36;
  uint uVar37;
  ulong uVar38;
  long lVar39;
  int iVar40;
  uint _w;
  long lVar41;
  int k_1;
  long lVar42;
  long lVar43;
  int k_2;
  int iVar44;
  long lVar45;
  int k_3;
  _func_int **pp_Var46;
  void *pvVar47;
  int iVar48;
  long lVar49;
  long lVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  Mat *pMVar54;
  undefined4 *puVar55;
  int iVar56;
  long lVar57;
  long lVar58;
  void *pvVar59;
  long lVar60;
  undefined1 (*pauVar61) [16];
  int k_5;
  int elempack;
  long lVar62;
  ulong uVar63;
  int kernel_h;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  long local_290;
  long local_260;
  long local_250;
  long local_230;
  long local_228;
  long local_220;
  long local_218;
  long local_210;
  ParamDict pd_6;
  ParamDict pd;
  size_t local_1c8;
  Allocator *local_1b8;
  int iStack_1b0;
  int iStack_1ac;
  undefined8 uStack_1a8;
  int local_1a0 [2];
  size_t local_198 [2];
  undefined4 uStack_188;
  undefined4 uStack_184;
  undefined8 local_180;
  undefined4 local_178;
  undefined8 local_170;
  undefined4 uStack_168;
  undefined4 uStack_164;
  undefined8 uStack_160;
  undefined4 local_158;
  undefined8 local_150;
  long local_148;
  void *local_140;
  long local_138;
  void *local_130;
  ulong local_128;
  ulong local_120;
  ParamDict pd_5;
  ModelBinFromMatArray local_90;
  int local_7c;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  void *local_38;
  
  pp_Var14 = this->_vptr_Convolution_x86_fma;
  p_Var34 = pp_Var14[-3];
  if (*(int *)((long)&(this->weight_winograd63_data).allocator + (long)p_Var34) != 0) {
    return 0;
  }
  switch(*(undefined4 *)(&(this->weight_winograd43_data).field_0x1c + (long)p_Var34)) {
  case 1:
    pLVar15 = create_layer(0x1a);
    ParamDict::ParamDict(&pd);
    (*pLVar15->_vptr_Layer[2])(pLVar15,&pd);
    break;
  case 2:
    pLVar15 = create_layer(0x1a);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,**(float **)
                           ((long)&(this->weight_winograd43_data).allocator + (long)p_Var34));
    (*pLVar15->_vptr_Layer[2])(pLVar15,&pd);
    break;
  case 3:
    pLVar15 = create_layer(0x36);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,**(float **)
                           ((long)&(this->weight_winograd43_data).allocator + (long)p_Var34));
    ParamDict::set(&pd,1,*(float *)(*(long *)((long)&(this->weight_winograd43_data).allocator +
                                             (long)p_Var34) + 4));
    (*pLVar15->_vptr_Layer[2])(pLVar15,&pd);
    break;
  case 4:
    pLVar15 = create_layer(0x1e);
    ParamDict::ParamDict(&pd);
    (*pLVar15->_vptr_Layer[2])(pLVar15,&pd);
    break;
  case 5:
    pLVar15 = create_layer(0x47);
    ParamDict::ParamDict(&pd);
    (*pLVar15->_vptr_Layer[2])(pLVar15,&pd);
    break;
  case 6:
    pLVar15 = create_layer(0x43);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,**(float **)
                           ((long)&(this->weight_winograd43_data).allocator + (long)p_Var34));
    ParamDict::set(&pd,1,*(float *)(*(long *)((long)&(this->weight_winograd43_data).allocator +
                                             (long)p_Var34) + 4));
    (*pLVar15->_vptr_Layer[2])(pLVar15,&pd);
    break;
  default:
    pLVar15 = (Layer *)0x0;
    goto LAB_001fce36;
  }
  ParamDict::~ParamDict(&pd);
  (*pLVar15->_vptr_Layer[4])(pLVar15,opt);
  pp_Var14 = this->_vptr_Convolution_x86_fma;
LAB_001fce36:
  this->activation = pLVar15;
  this->nT = opt->num_threads;
  p_Var34 = pp_Var14[-3];
  if ((opt->use_int8_inference == true) &&
     (*(long *)((long)&(this->weight_winograd63_data).c + (long)p_Var34) == 1)) {
    create_pipeline_int8_x86(this,opt);
    return 0;
  }
  uVar36 = *(uint *)((long)&(this->weight_winograd23_data).dims + (long)p_Var34);
  iVar56 = *(int *)((long)&(this->weight_winograd23_data).w + (long)p_Var34);
  iVar20 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var34);
  uVar38 = (long)*(int *)((long)&(this->weight_winograd43_data).elemsize + (long)(p_Var34 + 4)) /
           (long)(iVar20 * iVar56);
  uVar38 = (long)((ulong)(uint)((int)uVar38 >> 0x1f) << 0x20 | uVar38 & 0xffffffff) /
           (long)(int)uVar36;
  num_input = (uint)uVar38;
  if ((((iVar56 == iVar20 && opt->use_packing_layout == false) &&
       (iVar44 = *(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var34), iVar44 != 1)) &&
      (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var34) == iVar44)) &&
     ((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var34) == 1 &&
      (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var34) == 1)))) {
    pLVar15 = create_layer(6);
    this->convolution_dilation1 = pLVar15;
    ParamDict::ParamDict(&pd_5);
    ParamDict::set(&pd_5,0,*(int *)((long)&(this->weight_winograd23_data).dims +
                                   (long)this->_vptr_Convolution_x86_fma[-3]));
    ParamDict::set(&pd_5,1,*(int *)((long)&(this->weight_winograd23_data).w +
                                   (long)this->_vptr_Convolution_x86_fma[-3]));
    ParamDict::set(&pd_5,0xb,
                   *(int *)((long)&(this->weight_winograd23_data).h +
                           (long)this->_vptr_Convolution_x86_fma[-3]));
    ParamDict::set(&pd_5,2,1);
    ParamDict::set(&pd_5,0xc,1);
    ParamDict::set(&pd_5,3,1);
    ParamDict::set(&pd_5,0xd,1);
    ParamDict::set(&pd_5,4,0);
    ParamDict::set(&pd_5,0xe,0);
    ParamDict::set(&pd_5,5,*(int *)((long)&(this->weight_winograd43_data).elemsize +
                                   (long)this->_vptr_Convolution_x86_fma[-3]));
    ParamDict::set(&pd_5,6,*(int *)((long)&(this->weight_winograd43_data).elemsize +
                                   (long)(this->_vptr_Convolution_x86_fma[-3] + 4)));
    (*this->convolution_dilation1->_vptr_Layer[2])(this->convolution_dilation1,&pd_5);
    pp_Var14 = this->_vptr_Convolution_x86_fma;
    if (*(int *)((long)&(this->weight_winograd43_data).elemsize + (long)pp_Var14[-3]) == 0) {
      local_198[0] = 0;
      pd._vptr_ParamDict = (_func_int **)0x0;
      pd.d._0_4_ = 0;
      pd.d._4_4_ = 0;
      local_1b8 = (Allocator *)0x0;
      iStack_1b0 = 0;
      iStack_1ac = 0;
      uStack_1a8._0_4_ = 0;
      uStack_1a8._4_4_ = 0;
      local_1a0[0] = 0;
      p_Var34 = pp_Var14[-3];
      if (&pd != (ParamDict *)((long)&(this->weight_winograd63_data).dims + (long)p_Var34)) {
        piVar1 = *(int **)((long)&(this->weight_winograd63_data).h + (long)p_Var34);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        pd._vptr_ParamDict =
             *(_func_int ***)((long)&(this->weight_winograd63_data).dims + (long)p_Var34);
        uVar7 = *(undefined8 *)((long)&(this->weight_winograd63_data).h + (long)p_Var34);
        pd.d._0_4_ = (undefined4)uVar7;
        pd.d._4_4_ = (undefined4)((ulong)uVar7 >> 0x20);
        local_1b8 = *(Allocator **)((long)&this->convolution_dilation1 + (long)p_Var34);
        uVar7 = *(undefined8 *)((long)&this->gemm + (long)p_Var34);
        uStack_1a8 = *(undefined8 *)((long)&(this->scale_in_data).data + (long)p_Var34);
        iStack_1b0 = (int)uVar7;
        iStack_1ac = (int)((ulong)uVar7 >> 0x20);
        local_1a0[0] = *(int *)((long)&(this->scale_in_data).refcount + (long)p_Var34);
        local_198[0] = *(size_t *)((long)&(this->scale_in_data).elemsize + (long)p_Var34);
      }
      pLVar15 = this->convolution_dilation1;
      ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&pd_6,(Mat *)&pd);
      (*pLVar15->_vptr_Layer[3])(pLVar15,&pd_6);
      ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&pd_6);
      piVar1 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (local_1b8 == (Allocator *)0x0) {
            if (pd._vptr_ParamDict != (_func_int **)0x0) {
              free(pd._vptr_ParamDict);
            }
          }
          else {
            (*local_1b8->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      local_198[0] = 0;
      pd._vptr_ParamDict = (_func_int **)0x0;
      pd.d._0_4_ = 0;
      pd.d._4_4_ = 0;
      local_1b8 = (Allocator *)0x0;
      iStack_1b0 = 0;
      iStack_1ac = 0;
      uStack_1a8._0_4_ = 0;
      uStack_1a8._4_4_ = 0;
      local_1a0[0] = 0;
      p_Var34 = pp_Var14[-3];
      if (&pd != (ParamDict *)((long)&(this->weight_winograd63_data).dims + (long)p_Var34)) {
        piVar1 = *(int **)((long)&(this->weight_winograd63_data).h + (long)p_Var34);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        pd._vptr_ParamDict =
             *(_func_int ***)((long)&(this->weight_winograd63_data).dims + (long)p_Var34);
        uVar7 = *(undefined8 *)((long)&(this->weight_winograd63_data).h + (long)p_Var34);
        pd.d._0_4_ = (undefined4)uVar7;
        pd.d._4_4_ = (undefined4)((ulong)uVar7 >> 0x20);
        local_1b8 = *(Allocator **)((long)&this->convolution_dilation1 + (long)p_Var34);
        uVar7 = *(undefined8 *)((long)&this->gemm + (long)p_Var34);
        uStack_1a8 = *(undefined8 *)((long)&(this->scale_in_data).data + (long)p_Var34);
        iStack_1b0 = (int)uVar7;
        iStack_1ac = (int)((ulong)uVar7 >> 0x20);
        local_1a0[0] = *(int *)((long)&(this->scale_in_data).refcount + (long)p_Var34);
        local_198[0] = *(size_t *)((long)&(this->scale_in_data).elemsize + (long)p_Var34);
        p_Var34 = this->_vptr_Convolution_x86_fma[-3];
      }
      local_150 = 0;
      local_158 = 0;
      uStack_160 = 0;
      uStack_164 = 0;
      uStack_168 = 0;
      local_170 = 0;
      local_178 = 0;
      local_180 = 0;
      uStack_184 = 0;
      uStack_188 = 0;
      local_198[1] = 0;
      if ((_func_int *)(local_198 + 1) !=
          (_func_int *)((long)&(this->scale_in_data).elempack + (long)p_Var34)) {
        piVar1 = *(int **)((long)&(this->scale_in_data).allocator + (long)p_Var34);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        local_198[1] = *(size_t *)((long)&(this->scale_in_data).elempack + (long)p_Var34);
        uVar7 = *(undefined8 *)((long)&(this->scale_in_data).allocator + (long)p_Var34);
        uStack_188 = (undefined4)uVar7;
        uStack_184 = (undefined4)((ulong)uVar7 >> 0x20);
        local_180 = *(undefined8 *)((long)&(this->scale_in_data).dims + (long)p_Var34);
        local_178 = *(undefined4 *)((long)&(this->scale_in_data).h + (long)p_Var34);
        local_170 = *(undefined8 *)((long)&(this->scale_in_data).c + (long)p_Var34);
        uVar7 = *(undefined8 *)((long)&(this->scale_in_data).cstep + (long)p_Var34);
        uStack_160 = *(undefined8 *)(&this->field_0x1d8 + (long)p_Var34);
        uStack_168 = (undefined4)uVar7;
        uStack_164 = (undefined4)((ulong)uVar7 >> 0x20);
        local_158 = *(undefined4 *)(&this->field_0x1e0 + (long)p_Var34);
        local_150 = *(undefined8 *)(&this->field_0x1e8 + (long)p_Var34);
      }
      pLVar15 = this->convolution_dilation1;
      ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&pd_6,(Mat *)&pd);
      (*pLVar15->_vptr_Layer[3])(pLVar15,&pd_6);
      ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&pd_6);
      lVar35 = 0x48;
      do {
        piVar1 = *(int **)((long)&pd.d + lVar35);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            pvVar59 = *(void **)((long)&pd._vptr_ParamDict + lVar35);
            if (*(long **)((long)&local_1b8 + lVar35) == (long *)0x0) {
              if (pvVar59 != (void *)0x0) {
                free(pvVar59);
              }
            }
            else {
              (**(code **)(**(long **)((long)&local_1b8 + lVar35) + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)local_198 + lVar35) = 0;
        *(undefined1 (*) [16])((long)&pd.d + lVar35 + 4) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])((long)&pd._vptr_ParamDict + lVar35) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])((long)&iStack_1b0 + lVar35) = (undefined1  [16])0x0;
        *(undefined4 *)((long)local_1a0 + lVar35) = 0;
        lVar35 = lVar35 + -0x48;
      } while (lVar35 != -0x48);
    }
    (*this->convolution_dilation1->_vptr_Layer[4])(this->convolution_dilation1,opt);
    if (opt->lightmode == true) {
      p_Var34 = this->_vptr_Convolution_x86_fma[-3];
      piVar1 = *(int **)((long)&(this->weight_winograd63_data).h + (long)p_Var34);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          pvVar59 = *(void **)((long)&(this->weight_winograd63_data).dims + (long)p_Var34);
          plVar5 = *(long **)((long)&this->convolution_dilation1 + (long)p_Var34);
          if (plVar5 == (long *)0x0) {
            if (pvVar59 != (void *)0x0) {
              free(pvVar59);
            }
          }
          else {
            (**(code **)(*plVar5 + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&(this->scale_in_data).elemsize + (long)p_Var34) = 0;
      *(undefined1 (*) [16])((long)&(this->weight_winograd63_data).d + (long)p_Var34) =
           (undefined1  [16])0x0;
      *(undefined1 (*) [16])((long)&(this->weight_winograd63_data).dims + (long)p_Var34) =
           (undefined1  [16])0x0;
      *(undefined1 (*) [16])((long)&this->gemm + (long)p_Var34) = (undefined1  [16])0x0;
      *(undefined4 *)((long)&(this->scale_in_data).refcount + (long)p_Var34) = 0;
    }
    ParamDict::~ParamDict(&pd_5);
    return 0;
  }
  iVar44 = 1;
  local_290 = 1;
  if (opt->use_packing_layout != false) {
    local_290 = (ulong)((uVar38 & 3) == 0) * 3 + 1;
    if ((uVar38 & 7) == 0) {
      local_290 = 8;
    }
    iVar44 = (uint)((uVar36 & 3) == 0) * 3 + 1;
    if ((uVar36 & 7) == 0) {
      iVar44 = 8;
    }
  }
  bVar8 = opt->use_winograd23_convolution;
  if ((((bool)bVar8 == false) && (opt->use_winograd43_convolution == false)) &&
     (opt->use_winograd63_convolution != true)) {
LAB_001fd20f:
    iVar12 = get_cpu_level2_cache_size();
    p_Var34 = this->_vptr_Convolution_x86_fma[-3];
    uVar36 = *(uint *)((long)&(this->weight_winograd23_data).dims + (long)p_Var34);
    iVar56 = *(int *)((long)&(this->weight_winograd23_data).w + (long)p_Var34);
    auVar6 = *(undefined1 (*) [16])((long)&(this->weight_winograd23_data).h + (long)p_Var34);
    iVar20 = *(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var34);
    kernel_h = auVar6._0_4_;
    iVar48 = auVar6._4_4_;
    iVar40 = auVar6._8_4_;
    iVar24 = auVar6._12_4_;
    elempack = (int)local_290;
    if ((opt->use_sgemm_convolution == true) &&
       (iVar12 < (int)(uVar36 * iVar56 * kernel_h * iVar48 * iVar40 * iVar24 * iVar20 * num_input *
                      8) || (0x10 < (int)num_input || 0x10 < (int)uVar36))) {
LAB_001fd2af:
      pLVar15 = create_layer(0x4a);
      this->gemm = pLVar15;
      ParamDict::ParamDict(&pd_6);
      ParamDict::set(&pd_6,2,0);
      ParamDict::set(&pd_6,3,0);
      ParamDict::set(&pd_6,4,1);
      ParamDict::set(&pd_6,5,0);
      ParamDict::set(&pd_6,6,1);
      ParamDict::set(&pd_6,7,*(int *)((long)&(this->weight_winograd23_data).dims +
                                     (long)this->_vptr_Convolution_x86_fma[-3]));
      ParamDict::set(&pd_6,8,0);
      uVar36 = kernel_h * iVar56;
      ParamDict::set(&pd_6,9,uVar36 * num_input);
      ParamDict::set(&pd_6,10,-(uint)(*(int *)((long)&(this->weight_winograd43_data).elemsize +
                                              (long)this->_vptr_Convolution_x86_fma[-3]) == 0) | 1);
      ParamDict::set(&pd_6,0xb,1);
      (*this->gemm->_vptr_Layer[2])(this->gemm,&pd_6);
      pd_5._vptr_ParamDict = (_func_int **)0x0;
      pd_5.d._0_4_ = 0;
      pd_5.d._4_4_ = 0;
      pMVar54 = (Mat *)((long)&(this->weight_winograd63_data).dims +
                       (long)this->_vptr_Convolution_x86_fma[-3]);
      Mat::reshape((Mat *)&pd,pMVar54,uVar36,num_input,*(int *)&pMVar54[-2].data,(Allocator *)0x0);
      Mat::create((Mat *)&pd_5,uVar36 * num_input,
                  *(int *)((long)&(this->weight_winograd23_data).dims +
                          (long)this->_vptr_Convolution_x86_fma[-3]),4,(Allocator *)0x0);
      pp_Var14 = this->_vptr_Convolution_x86_fma;
      p_Var34 = pp_Var14[-3];
      if (0 < *(int *)((long)&(this->weight_winograd23_data).dims + (long)p_Var34)) {
        lVar35 = 0;
        do {
          if (elempack <= (int)num_input) {
            pp_Var21 = (_func_int **)(local_1c8 * local_198[0] * lVar35 + (long)pd._vptr_ParamDict);
            lVar50 = 0;
            pp_Var46 = pd_5._vptr_ParamDict;
            do {
              if (0 < (int)uVar36) {
                uVar38 = 0;
                lVar41 = local_290;
                pp_Var29 = pp_Var21;
                pp_Var28 = pp_Var21;
                do {
                  do {
                    *(undefined4 *)pp_Var46 = *(undefined4 *)pp_Var29;
                    pp_Var46 = (_func_int **)((long)pp_Var46 + 4);
                    lVar41 = lVar41 + -1;
                    pp_Var29 = (_func_int **)((long)pp_Var29 + (long)iStack_1ac * local_1c8);
                  } while (lVar41 != 0);
                  uVar38 = uVar38 + 1;
                  pp_Var29 = (_func_int **)((long)pp_Var28 + 4);
                  lVar41 = local_290;
                  pp_Var28 = pp_Var29;
                } while (uVar38 != uVar36);
              }
              lVar50 = lVar50 + local_290;
              pp_Var21 = (_func_int **)((long)pp_Var21 + (long)iStack_1ac * local_1c8 * local_290);
            } while (lVar50 < (long)((long)(int)num_input - (ulong)(elempack - 1)));
            p_Var34 = pp_Var14[-3];
          }
          lVar35 = lVar35 + 1;
        } while (lVar35 < *(int *)((long)&(this->weight_winograd23_data).dims + (long)p_Var34));
      }
      piVar1 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (local_1b8 == (Allocator *)0x0) {
            if (pd._vptr_ParamDict != (_func_int **)0x0) {
              free(pd._vptr_ParamDict);
            }
          }
          else {
            (*local_1b8->_vptr_Allocator[3])();
          }
        }
      }
      if (*(int *)((long)&(this->weight_winograd43_data).elemsize +
                  (long)this->_vptr_Convolution_x86_fma[-3]) == 0) {
        piVar1 = (int *)CONCAT44(pd_5.d._4_4_,pd_5.d._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        pd._vptr_ParamDict = pd_5._vptr_ParamDict;
        pd.d._0_4_ = pd_5.d._0_4_;
        pd.d._4_4_ = pd_5.d._4_4_;
        local_1b8 = (Allocator *)0x0;
        iStack_1b0 = 0;
        iStack_1ac = 0;
        uStack_1a8._0_4_ = 0;
        uStack_1a8._4_4_ = 0;
        local_1a0[0] = 0;
        local_198[0] = 0;
        pLVar15 = this->gemm;
        ModelBinFromMatArray::ModelBinFromMatArray(&local_90,(Mat *)&pd);
        (*pLVar15->_vptr_Layer[3])(pLVar15,&local_90);
        ModelBinFromMatArray::~ModelBinFromMatArray(&local_90);
        piVar1 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            if (local_1b8 == (Allocator *)0x0) {
              if (pd._vptr_ParamDict != (_func_int **)0x0) {
                free(pd._vptr_ParamDict);
              }
            }
            else {
              (*local_1b8->_vptr_Allocator[3])();
            }
          }
        }
      }
      else {
        piVar1 = (int *)CONCAT44(pd_5.d._4_4_,pd_5.d._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        local_150 = 0;
        local_158 = 0;
        uStack_160 = 0;
        uStack_164 = 0;
        uStack_168 = 0;
        local_170 = 0;
        local_178 = 0;
        local_180 = 0;
        uStack_184 = 0;
        uStack_188 = 0;
        local_198[1] = 0;
        p_Var34 = this->_vptr_Convolution_x86_fma[-3];
        if ((_func_int *)(local_198 + 1) !=
            (_func_int *)((long)&(this->scale_in_data).elempack + (long)p_Var34)) {
          piVar1 = *(int **)((long)&(this->scale_in_data).allocator + (long)p_Var34);
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + 1;
            UNLOCK();
          }
          local_198[1] = *(size_t *)((long)&(this->scale_in_data).elempack + (long)p_Var34);
          uVar7 = *(undefined8 *)((long)&(this->scale_in_data).allocator + (long)p_Var34);
          uStack_188 = (undefined4)uVar7;
          uStack_184 = (undefined4)((ulong)uVar7 >> 0x20);
          local_180 = *(undefined8 *)((long)&(this->scale_in_data).dims + (long)p_Var34);
          local_178 = *(undefined4 *)((long)&(this->scale_in_data).h + (long)p_Var34);
          local_170 = *(undefined8 *)((long)&(this->scale_in_data).c + (long)p_Var34);
          uVar7 = *(undefined8 *)((long)&(this->scale_in_data).cstep + (long)p_Var34);
          uStack_160 = *(undefined8 *)(&this->field_0x1d8 + (long)p_Var34);
          uStack_168 = (undefined4)uVar7;
          uStack_164 = (undefined4)((ulong)uVar7 >> 0x20);
          local_158 = *(undefined4 *)(&this->field_0x1e0 + (long)p_Var34);
          local_150 = *(undefined8 *)(&this->field_0x1e8 + (long)p_Var34);
        }
        local_198[0] = 0;
        local_1a0[0] = 0;
        uStack_1a8._0_4_ = 0;
        uStack_1a8._4_4_ = 0;
        iStack_1ac = 0;
        iStack_1b0 = 0;
        local_1b8 = (Allocator *)0x0;
        pd.d._4_4_ = pd_5.d._4_4_;
        pd.d._0_4_ = pd_5.d._0_4_;
        pd._vptr_ParamDict = pd_5._vptr_ParamDict;
        pLVar15 = this->gemm;
        ModelBinFromMatArray::ModelBinFromMatArray(&local_90,(Mat *)&pd);
        (*pLVar15->_vptr_Layer[3])(pLVar15,&local_90);
        ModelBinFromMatArray::~ModelBinFromMatArray(&local_90);
        lVar35 = 0x48;
        do {
          piVar1 = *(int **)((long)&pd.d + lVar35);
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              pvVar59 = *(void **)((long)&pd._vptr_ParamDict + lVar35);
              if (*(long **)((long)&local_1b8 + lVar35) == (long *)0x0) {
                if (pvVar59 != (void *)0x0) {
                  free(pvVar59);
                }
              }
              else {
                (**(code **)(**(long **)((long)&local_1b8 + lVar35) + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)local_198 + lVar35) = 0;
          *(undefined1 (*) [16])((long)&pd.d + lVar35 + 4) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])((long)&pd._vptr_ParamDict + lVar35) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])((long)&iStack_1b0 + lVar35) = (undefined1  [16])0x0;
          *(undefined4 *)((long)local_1a0 + lVar35) = 0;
          lVar35 = lVar35 + -0x48;
        } while (lVar35 != -0x48);
      }
      (*this->gemm->_vptr_Layer[4])(this->gemm,opt);
      piVar1 = (int *)CONCAT44(pd_5.d._4_4_,pd_5.d._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if ((*piVar1 == 0) && (pd_5._vptr_ParamDict != (_func_int **)0x0)) {
          free(pd_5._vptr_ParamDict);
        }
      }
      ParamDict::~ParamDict(&pd_6);
    }
    else {
      if (iVar56 == 1) {
        if (kernel_h != 1) {
          bVar9 = elempack == 8;
          bVar8 = (iVar44 != 8 || elempack != 8) && elempack == 1;
          goto LAB_001fdace;
        }
        goto LAB_001fd2af;
      }
      bVar9 = elempack == 8;
      if ((iVar44 == 8) && (elempack == 8)) {
        bVar9 = true;
        auVar64 = _DAT_00558050;
        if ((iVar56 == 2) || (auVar64 = _DAT_00558060, iVar56 == 3)) {
          bVar8 = 0;
          if ((auVar6 == auVar64) && (bVar8 = 0, iVar20 == 1)) goto LAB_001fdaf9;
        }
        else {
          bVar8 = 0;
        }
LAB_001fdace:
        if ((((((iVar44 == 1) && (bVar9)) && (iVar56 == 3)) && ((iVar24 == 1 && (kernel_h == 3))))
            && (iVar48 == 1)) && ((iVar40 == 1 && (iVar20 == 1)))) goto LAB_001fdaf9;
        if ((((~bVar8 & 1) == 0 && iVar44 == 4) &&
            (((iVar56 == 3 && (kernel_h == 3)) && (iVar48 == 1)))) && (iVar40 == 1)) {
          if (iVar24 == 2) {
            if (iVar20 == 2) goto LAB_001fdaf9;
          }
          else if ((iVar24 == 1) && (iVar20 == 1)) goto LAB_001fdaf9;
        }
        uVar38 = (ulong)(int)uVar36;
        pMVar54 = &this->weight_data_tm;
        uVar37 = kernel_h * iVar56;
        local_148 = (long)(int)uVar37;
        lVar35 = (long)(int)num_input;
        uVar51 = (ulong)uVar37;
        if ((int)uVar36 < 8) {
          uVar25 = num_input;
          if ((int)uVar36 < 4) {
            if ((int)uVar36 < 2) {
              uVar26 = uVar36;
              if ((int)num_input < 8) {
                if ((int)num_input < 4) {
                  _w = uVar37;
                  if (1 < (int)num_input) {
                    iVar56 = uVar37 * 2;
                    uVar25 = uVar36;
                    goto LAB_001ff89c;
                  }
                }
                else {
                  _w = uVar37 * 4;
                  uVar25 = (num_input & 1) + 1 + (uint)((num_input >> 1 & 1) != 0);
                }
              }
              else {
                _w = uVar37 * 8;
                uVar25 = (num_input & 1) + (num_input >> 3) + (num_input >> 2 & 1) +
                         (uint)((num_input >> 1 & 1) != 0);
              }
              goto LAB_001fe89a;
            }
            if (7 < (int)num_input) {
              _w = uVar37 * 0x10;
              uVar25 = (num_input & 1) + (num_input >> 3) + (num_input >> 2 & 1) +
                       (uint)((num_input >> 1 & 1) != 0);
LAB_001fe739:
              uVar26 = (uVar36 & 1) + 1;
              goto LAB_001fe89a;
            }
            if (3 < (int)num_input) {
              uVar25 = (num_input & 1) + 1 + (uint)((num_input >> 1 & 1) != 0);
              _w = uVar37 * 8;
              goto LAB_001fe739;
            }
            if ((int)num_input < 2) {
              iVar56 = uVar37 * 2;
              uVar25 = (uVar36 & 1) + 1;
              uVar26 = num_input;
            }
            else {
              iVar56 = uVar37 * 4;
              uVar25 = (uVar36 & 1) + 1;
LAB_001ff89c:
              uVar26 = (num_input & 1) + 1;
            }
            uVar52 = 0;
            Mat::create(pMVar54,iVar56,uVar26,uVar25,4,(Allocator *)0x0);
          }
          else {
            if ((int)num_input < 8) {
              if ((int)num_input < 4) {
                if ((int)num_input < 2) {
                  _w = uVar37 * 4;
                  uVar26 = (uVar36 & 1) + 1 + (uint)((uVar36 >> 1 & 1) != 0);
                }
                else {
                  _w = uVar37 * 8;
                  uVar25 = (num_input & 1) + 1;
                  uVar26 = (uVar36 & 1) + 1 + (uint)((uVar36 >> 1 & 1) != 0);
                }
              }
              else {
                _w = uVar37 * 0x10;
                uVar25 = (num_input & 1) + 1 + (uint)((num_input >> 1 & 1) != 0);
                uVar26 = (uVar36 & 1) + 1 + (uint)((uVar36 >> 1 & 1) != 0);
              }
            }
            else {
              _w = uVar37 * 0x20;
              uVar25 = (num_input & 1) + (num_input >> 3) + (num_input >> 2 & 1) +
                       (uint)((num_input >> 1 & 1) != 0);
              uVar26 = (uVar36 & 1) + 1 + (uint)((uVar36 >> 1 & 1) != 0);
            }
LAB_001fe89a:
            uVar52 = 0;
            Mat::create(pMVar54,_w,uVar25,uVar26,4,(Allocator *)0x0);
          }
        }
        else {
          if ((int)num_input < 8) {
            if (3 < (int)num_input) {
              iVar56 = uVar37 * 0x20;
              uVar25 = (num_input & 1) + 1 + (uint)((num_input >> 1 & 1) != 0);
              goto LAB_001fddbe;
            }
            if (1 < (int)num_input) {
              iVar56 = uVar37 * 0x10;
              uVar25 = (num_input & 1) + 1;
              goto LAB_001fddbe;
            }
            iVar56 = uVar37 * 8;
            iVar20 = (uVar36 & 1) + (uVar36 >> 3) + (uVar36 >> 2 & 1) +
                     (uint)((uVar36 >> 1 & 1) != 0);
            uVar25 = num_input;
          }
          else {
            iVar56 = uVar37 * 0x40;
            uVar25 = (num_input & 1) + (num_input >> 3) + (num_input >> 2 & 1) +
                     (uint)((num_input >> 1 & 1) != 0);
LAB_001fddbe:
            iVar20 = (uVar36 & 1) + (uVar36 >> 3) + (uVar36 >> 2 & 1) +
                     (uint)((uVar36 >> 1 & 1) != 0);
          }
          Mat::create(pMVar54,iVar56,uVar25,iVar20,4,(Allocator *)0x0);
          lVar41 = *(long *)((long)&(this->weight_winograd63_data).dims + (long)p_Var34);
          iVar40 = uVar37 * num_input;
          sVar2 = (this->weight_data_tm).elemsize;
          sVar3 = (this->weight_data_tm).cstep;
          local_130 = (this->weight_data_tm).data;
          iVar48 = uVar37 * num_input;
          iVar56 = iVar48 * 8;
          lVar50 = local_148 * 4;
          uVar25 = iVar48 * 2;
          iVar20 = iVar48 * 3;
          iVar44 = iVar48 * 5;
          iVar24 = iVar48 * 6;
          local_138 = CONCAT44(local_138._4_4_,iVar56);
          iVar12 = iVar48 * 7;
          uVar26 = iVar48 * 4;
          iVar48 = 0;
          uVar63 = 0;
          do {
            local_128 = (ulong)uVar25;
            local_120 = (ulong)uVar26;
            local_140 = (void *)CONCAT44(local_140._4_4_,iVar40);
            puVar16 = (undefined4 *)((uVar63 >> 3) * sVar2 * sVar3 + (long)local_130);
            if ((int)num_input < 8) {
              uVar52 = 0;
            }
            else {
              lVar31 = 0;
              uVar53 = 0;
              do {
                if (0 < (int)uVar37) {
                  uVar52 = 0;
                  lVar30 = lVar31;
                  do {
                    puVar55 = puVar16;
                    lVar39 = 0;
                    lVar17 = lVar30;
                    do {
                      *(undefined4 *)((long)puVar55 + lVar39) =
                           *(undefined4 *)(lVar41 + (long)iVar48 * 4 + lVar17);
                      *(undefined4 *)((long)puVar55 + lVar39 + 4) =
                           *(undefined4 *)(lVar41 + (long)iVar40 * 4 + lVar17);
                      *(undefined4 *)((long)puVar55 + lVar39 + 8) =
                           *(undefined4 *)(lVar41 + (long)(int)uVar25 * 4 + lVar17);
                      *(undefined4 *)((long)puVar55 + lVar39 + 0xc) =
                           *(undefined4 *)(lVar41 + (long)iVar20 * 4 + lVar17);
                      *(undefined4 *)((long)puVar55 + lVar39 + 0x10) =
                           *(undefined4 *)(lVar41 + (long)(int)uVar26 * 4 + lVar17);
                      *(undefined4 *)((long)puVar55 + lVar39 + 0x14) =
                           *(undefined4 *)(lVar41 + (long)iVar44 * 4 + lVar17);
                      *(undefined4 *)((long)puVar55 + lVar39 + 0x18) =
                           *(undefined4 *)(lVar41 + (long)iVar24 * 4 + lVar17);
                      *(undefined4 *)((long)puVar55 + lVar39 + 0x1c) =
                           *(undefined4 *)(lVar41 + (long)iVar12 * 4 + lVar17);
                      lVar39 = lVar39 + 0x20;
                      lVar17 = lVar17 + lVar50;
                    } while ((int)lVar39 != 0x100);
                    uVar52 = uVar52 + 1;
                    lVar30 = lVar30 + 4;
                    puVar16 = (undefined4 *)((long)puVar55 + lVar39);
                  } while (uVar52 != uVar51);
                  puVar16 = (undefined4 *)((long)puVar55 + lVar39);
                }
                uVar52 = uVar53 + 8;
                lVar30 = uVar53 + 0xf;
                lVar31 = lVar31 + uVar51 * 0x20;
                uVar53 = uVar52;
              } while (lVar30 < lVar35);
            }
            lVar60 = (long)iVar12 * 4;
            lVar49 = (long)iVar24 * 4;
            lVar45 = (long)iVar44 * 4;
            lVar30 = (long)(int)uVar26 * 4;
            lVar31 = (long)iVar20 * 4;
            lVar17 = (long)(int)uVar25 * 4;
            lVar39 = (long)iVar40 * 4;
            lVar57 = (long)iVar48 * 4;
            if ((int)((uint)uVar52 | 3) < (int)num_input) {
              lVar62 = lVar50 * (uVar52 & 0xffffffff);
              lVar33 = 0;
              uVar53 = uVar52 & 0xffffffff;
              do {
                if (0 < (int)uVar37) {
                  uVar52 = 0;
                  lVar32 = lVar33;
                  do {
                    puVar55 = puVar16;
                    lVar42 = 0;
                    lVar18 = lVar32;
                    do {
                      *(undefined4 *)((long)puVar55 + lVar42) =
                           *(undefined4 *)(lVar57 + lVar62 + lVar41 + lVar18);
                      *(undefined4 *)((long)puVar55 + lVar42 + 4) =
                           *(undefined4 *)(lVar62 + lVar39 + lVar41 + lVar18);
                      *(undefined4 *)((long)puVar55 + lVar42 + 8) =
                           *(undefined4 *)(lVar17 + lVar62 + lVar41 + lVar18);
                      *(undefined4 *)((long)puVar55 + lVar42 + 0xc) =
                           *(undefined4 *)(lVar62 + lVar31 + lVar41 + lVar18);
                      *(undefined4 *)((long)puVar55 + lVar42 + 0x10) =
                           *(undefined4 *)(lVar62 + lVar30 + lVar41 + lVar18);
                      *(undefined4 *)((long)puVar55 + lVar42 + 0x14) =
                           *(undefined4 *)(lVar45 + lVar62 + lVar41 + lVar18);
                      *(undefined4 *)((long)puVar55 + lVar42 + 0x18) =
                           *(undefined4 *)(lVar49 + lVar62 + lVar41 + lVar18);
                      *(undefined4 *)((long)puVar55 + lVar42 + 0x1c) =
                           *(undefined4 *)(lVar62 + lVar60 + lVar41 + lVar18);
                      lVar42 = lVar42 + 0x20;
                      lVar18 = lVar18 + lVar50;
                    } while ((int)lVar42 != 0x80);
                    uVar52 = uVar52 + 1;
                    lVar32 = lVar32 + 4;
                    puVar16 = (undefined4 *)((long)puVar55 + lVar42);
                  } while (uVar52 != uVar51);
                  puVar16 = (undefined4 *)((long)puVar55 + lVar42);
                }
                uVar52 = uVar53 + 4;
                lVar32 = uVar53 + 7;
                lVar33 = lVar33 + local_148 * 0x10;
                uVar53 = uVar52;
              } while (lVar32 < lVar35);
            }
            if ((int)((uint)uVar52 | 1) < (int)num_input) {
              lVar62 = lVar50 * (uVar52 & 0xffffffff);
              lVar33 = 0;
              uVar53 = uVar52 & 0xffffffff;
              do {
                if (0 < (int)uVar37) {
                  uVar52 = 0;
                  lVar32 = lVar33;
                  do {
                    lVar18 = lVar32;
                    bVar9 = true;
                    do {
                      bVar10 = bVar9;
                      *puVar16 = *(undefined4 *)(lVar57 + lVar62 + lVar41 + lVar18);
                      puVar16[1] = *(undefined4 *)(lVar62 + lVar39 + lVar41 + lVar18);
                      puVar16[2] = *(undefined4 *)(lVar17 + lVar62 + lVar41 + lVar18);
                      puVar16[3] = *(undefined4 *)(lVar62 + lVar31 + lVar41 + lVar18);
                      puVar16[4] = *(undefined4 *)(lVar62 + lVar30 + lVar41 + lVar18);
                      puVar16[5] = *(undefined4 *)(lVar62 + lVar45 + lVar41 + lVar18);
                      puVar16[6] = *(undefined4 *)(lVar62 + lVar49 + lVar41 + lVar18);
                      puVar16[7] = *(undefined4 *)(lVar62 + lVar60 + lVar41 + lVar18);
                      puVar16 = puVar16 + 8;
                      lVar18 = lVar18 + lVar50;
                      bVar9 = false;
                    } while (bVar10);
                    uVar52 = uVar52 + 1;
                    lVar32 = lVar32 + 4;
                  } while (uVar52 != uVar51);
                }
                uVar52 = uVar53 + 2;
                lVar32 = uVar53 + 3;
                lVar33 = lVar33 + local_148 * 8;
                uVar53 = uVar52;
              } while (lVar32 < lVar35);
            }
            if ((int)uVar52 < (int)num_input) {
              lVar32 = (long)(int)uVar52;
              lVar33 = lVar50 * lVar32;
              lVar62 = lVar60 + lVar33 + lVar41;
              lVar60 = lVar49 + lVar33 + lVar41;
              lVar49 = lVar45 + lVar33 + lVar41;
              lVar45 = lVar30 + lVar33 + lVar41;
              lVar30 = lVar31 + lVar33 + lVar41;
              lVar31 = lVar17 + lVar33 + lVar41;
              lVar17 = lVar39 + lVar33 + lVar41;
              lVar39 = lVar33 + lVar57 + lVar41;
              do {
                if (0 < (int)uVar37) {
                  lVar57 = 0;
                  puVar55 = puVar16;
                  do {
                    puVar23 = puVar55;
                    puVar55 = puVar16 + lVar57 * 2;
                    *puVar55 = *(undefined4 *)(lVar39 + lVar57);
                    puVar55[1] = *(undefined4 *)(lVar17 + lVar57);
                    puVar55[2] = *(undefined4 *)(lVar31 + lVar57);
                    puVar55[3] = *(undefined4 *)(lVar30 + lVar57);
                    puVar55[4] = *(undefined4 *)(lVar45 + lVar57);
                    puVar55[5] = *(undefined4 *)(lVar49 + lVar57);
                    puVar55[6] = *(undefined4 *)(lVar60 + lVar57);
                    puVar55[7] = *(undefined4 *)(lVar62 + lVar57);
                    lVar57 = lVar57 + 4;
                    puVar55 = puVar55 + 8;
                  } while (uVar51 * 4 != lVar57);
                  puVar16 = puVar23 + 8;
                }
                lVar32 = lVar32 + 1;
                lVar62 = lVar62 + lVar50;
                lVar60 = lVar60 + lVar50;
                lVar49 = lVar49 + lVar50;
                lVar45 = lVar45 + lVar50;
                lVar30 = lVar30 + lVar50;
                lVar31 = lVar31 + lVar50;
                lVar17 = lVar17 + lVar50;
                lVar39 = lVar39 + lVar50;
              } while (lVar32 != lVar35);
            }
            uVar52 = uVar63 + 8;
            uVar53 = uVar63 + 0xf;
            iVar48 = iVar48 + iVar56;
            iVar40 = iVar40 + iVar56;
            uVar25 = uVar25 + iVar56;
            iVar20 = iVar20 + iVar56;
            uVar26 = uVar26 + iVar56;
            iVar44 = iVar44 + iVar56;
            iVar24 = iVar24 + iVar56;
            iVar12 = iVar12 + iVar56;
            uVar63 = uVar52;
          } while (uVar53 < uVar36);
        }
        uVar25 = (uint)uVar52;
        if ((int)(uVar25 | 3) < (int)uVar36) {
          lVar31 = *(long *)((long)&(this->weight_winograd63_data).dims + (long)p_Var34);
          local_140 = (this->weight_data_tm).data;
          local_120 = (this->weight_data_tm).elemsize * (this->weight_data_tm).cstep;
          iVar44 = uVar37 * num_input;
          iVar20 = (uVar25 | 3) * iVar44;
          iVar56 = iVar44 * 4;
          local_128 = CONCAT44(local_128._4_4_,iVar56);
          lVar30 = uVar51 * 0x20;
          lVar50 = local_148 * 4;
          iVar12 = (uVar25 + 2) * iVar44;
          iVar24 = (uVar25 + 1) * iVar44;
          iVar44 = iVar44 * uVar25;
          lVar41 = local_148 * 8;
          uVar63 = uVar52 & 0xffffffff;
          do {
            puVar16 = (undefined4 *)
                      ((((uint)(uVar63 >> 3) & 0x1fffffff) + (uint)(((uint)uVar63 >> 2 & 1) != 0)) *
                       local_120 + (long)local_140);
            if ((int)num_input < 8) {
              uVar52 = 0;
            }
            else {
              lVar17 = lVar31 + (long)iVar20 * 4;
              lVar39 = lVar31 + (long)iVar12 * 4;
              lVar45 = lVar31 + (long)iVar24 * 4;
              lVar49 = lVar31 + (long)iVar44 * 4;
              uVar53 = 0;
              do {
                if (0 < (int)uVar37) {
                  uVar52 = 0;
                  lVar57 = lVar49;
                  lVar60 = lVar45;
                  lVar33 = lVar39;
                  lVar62 = lVar17;
                  do {
                    puVar55 = puVar16;
                    lVar18 = 0;
                    lVar32 = 0;
                    do {
                      *(undefined4 *)((long)puVar55 + lVar32) = *(undefined4 *)(lVar57 + lVar18);
                      *(undefined4 *)((long)puVar55 + lVar32 + 4) = *(undefined4 *)(lVar60 + lVar18)
                      ;
                      *(undefined4 *)((long)puVar55 + lVar32 + 8) = *(undefined4 *)(lVar33 + lVar18)
                      ;
                      *(undefined4 *)((long)puVar55 + lVar32 + 0xc) =
                           *(undefined4 *)(lVar62 + lVar18);
                      lVar32 = lVar32 + 0x10;
                      lVar18 = lVar18 + lVar50;
                    } while ((int)lVar32 != 0x80);
                    uVar52 = uVar52 + 1;
                    lVar62 = lVar62 + 4;
                    lVar33 = lVar33 + 4;
                    lVar60 = lVar60 + 4;
                    lVar57 = lVar57 + 4;
                    puVar16 = (undefined4 *)((long)puVar55 + lVar32);
                  } while (uVar52 != uVar51);
                  puVar16 = (undefined4 *)((long)puVar55 + lVar32);
                }
                uVar52 = uVar53 + 8;
                lVar57 = uVar53 + 0xf;
                lVar17 = lVar17 + lVar30;
                lVar39 = lVar39 + lVar30;
                lVar45 = lVar45 + lVar30;
                lVar49 = lVar49 + lVar30;
                uVar53 = uVar52;
              } while (lVar57 < lVar35);
            }
            lVar49 = (long)iVar20 * 4;
            lVar17 = (long)iVar12 * 4;
            lVar39 = (long)iVar24 * 4;
            lVar45 = (long)iVar44 * 4;
            if ((int)((uint)uVar52 | 3) < (int)num_input) {
              lVar57 = lVar50 * (uVar52 & 0xffffffff);
              lVar60 = 0;
              uVar53 = uVar52 & 0xffffffff;
              do {
                if (0 < (int)uVar37) {
                  uVar52 = 0;
                  lVar33 = lVar60;
                  do {
                    puVar55 = puVar16;
                    lVar32 = 0;
                    lVar62 = lVar33;
                    do {
                      *(undefined4 *)((long)puVar55 + lVar32) =
                           *(undefined4 *)(lVar57 + lVar45 + lVar31 + lVar62);
                      *(undefined4 *)((long)puVar55 + lVar32 + 4) =
                           *(undefined4 *)(lVar57 + lVar39 + lVar31 + lVar62);
                      *(undefined4 *)((long)puVar55 + lVar32 + 8) =
                           *(undefined4 *)(lVar57 + lVar17 + lVar31 + lVar62);
                      *(undefined4 *)((long)puVar55 + lVar32 + 0xc) =
                           *(undefined4 *)(lVar57 + lVar49 + lVar31 + lVar62);
                      lVar32 = lVar32 + 0x10;
                      lVar62 = lVar62 + lVar50;
                    } while ((int)lVar32 != 0x40);
                    uVar52 = uVar52 + 1;
                    lVar33 = lVar33 + 4;
                    puVar16 = (undefined4 *)((long)puVar55 + lVar32);
                  } while (uVar52 != uVar51);
                  puVar16 = (undefined4 *)((long)puVar55 + lVar32);
                }
                uVar52 = uVar53 + 4;
                lVar33 = uVar53 + 7;
                lVar60 = lVar60 + local_148 * 0x10;
                uVar53 = uVar52;
              } while (lVar33 < lVar35);
            }
            if ((int)((uint)uVar52 | 1) < (int)num_input) {
              lVar62 = lVar50 * (uVar52 & 0xffffffff);
              lVar33 = lVar62 + lVar49 + lVar31;
              lVar60 = lVar62 + lVar17 + lVar31;
              lVar57 = lVar62 + lVar39 + lVar31;
              lVar62 = lVar62 + lVar45 + lVar31;
              uVar53 = uVar52 & 0xffffffff;
              do {
                if (0 < (int)uVar37) {
                  uVar52 = 0;
                  lVar32 = lVar62;
                  lVar18 = lVar60;
                  lVar42 = lVar33;
                  lVar58 = lVar57;
                  do {
                    lVar43 = 0;
                    bVar9 = true;
                    do {
                      bVar10 = bVar9;
                      *puVar16 = *(undefined4 *)(lVar32 + lVar43);
                      puVar16[1] = *(undefined4 *)(lVar58 + lVar43);
                      puVar16[2] = *(undefined4 *)(lVar18 + lVar43);
                      puVar16[3] = *(undefined4 *)(lVar42 + lVar43);
                      puVar16 = puVar16 + 4;
                      lVar43 = lVar43 + lVar50;
                      bVar9 = false;
                    } while (bVar10);
                    uVar52 = uVar52 + 1;
                    lVar42 = lVar42 + 4;
                    lVar18 = lVar18 + 4;
                    lVar58 = lVar58 + 4;
                    lVar32 = lVar32 + 4;
                  } while (uVar52 != uVar51);
                }
                uVar52 = uVar53 + 2;
                lVar32 = uVar53 + 3;
                lVar33 = lVar33 + lVar41;
                lVar60 = lVar60 + lVar41;
                lVar57 = lVar57 + lVar41;
                lVar62 = lVar62 + lVar41;
                uVar53 = uVar52;
              } while (lVar32 < lVar35);
            }
            if ((int)uVar52 < (int)num_input) {
              lVar57 = (long)(int)uVar52;
              lVar60 = lVar50 * lVar57;
              lVar49 = lVar49 + lVar60 + lVar31;
              lVar17 = lVar17 + lVar60 + lVar31;
              lVar39 = lVar39 + lVar60 + lVar31;
              lVar45 = lVar60 + lVar45 + lVar31;
              do {
                if (0 < (int)uVar37) {
                  lVar60 = 0;
                  puVar55 = puVar16;
                  do {
                    puVar23 = puVar55;
                    puVar55 = puVar16 + lVar60;
                    *puVar55 = *(undefined4 *)(lVar45 + lVar60);
                    puVar55[1] = *(undefined4 *)(lVar39 + lVar60);
                    puVar55[2] = *(undefined4 *)(lVar17 + lVar60);
                    puVar55[3] = *(undefined4 *)(lVar49 + lVar60);
                    lVar60 = lVar60 + 4;
                    puVar55 = puVar55 + 4;
                  } while (uVar51 * 4 != lVar60);
                  puVar16 = puVar23 + 4;
                }
                lVar57 = lVar57 + 1;
                lVar49 = lVar49 + lVar50;
                lVar17 = lVar17 + lVar50;
                lVar39 = lVar39 + lVar50;
                lVar45 = lVar45 + lVar50;
              } while (lVar57 != lVar35);
            }
            uVar52 = uVar63 + 4;
            lVar17 = uVar63 + 7;
            iVar20 = iVar20 + iVar56;
            iVar12 = iVar12 + iVar56;
            iVar24 = iVar24 + iVar56;
            iVar44 = iVar44 + iVar56;
            uVar63 = uVar52;
          } while (lVar17 < (long)uVar38);
        }
        uVar25 = (uint)uVar52 | 1;
        if ((int)uVar25 < (int)uVar36) {
          lVar41 = *(long *)((long)&(this->weight_winograd63_data).dims + (long)p_Var34);
          local_38 = (this->weight_data_tm).data;
          local_40 = (this->weight_data_tm).elemsize * (this->weight_data_tm).cstep;
          local_48 = lVar41 + (long)(int)(uVar37 * 7) * 4;
          iVar20 = uVar37 * num_input;
          iVar56 = uVar25 * iVar20;
          local_7c = iVar20 * 2;
          lVar30 = uVar51 * 0x20;
          local_50 = lVar41 + (long)(int)(uVar37 * 6) * 4;
          local_58 = lVar41 + (long)(int)(uVar37 * 5) * 4;
          local_60 = lVar41 + (long)(int)(uVar37 * 4) * 4;
          local_68 = lVar41 + (long)(int)(uVar37 * 3) * 4;
          local_70 = lVar41 + (long)(int)(uVar37 * 2) * 4;
          iVar20 = iVar20 * (uint)uVar52;
          lVar31 = local_148 * 0x10;
          lVar50 = local_148 * 4;
          local_78 = lVar41 + local_148 * 4;
          uVar63 = uVar52 & 0xffffffff;
          do {
            pvVar59 = (void *)(long)iVar56;
            lVar17 = (long)iVar20;
            puVar16 = (undefined4 *)
                      ((ulong)(((uint)(uVar63 >> 2) & 1) + ((uint)(uVar63 >> 3) & 0x1fffffff) +
                              (uint)(((uint)uVar63 >> 1 & 1) != 0)) * local_40 + (long)local_38);
            if ((int)num_input < 8) {
              pvVar47 = (void *)0x0;
            }
            else {
              local_260 = local_48 + (long)pvVar59 * 4;
              local_120 = local_50 + (long)pvVar59 * 4;
              local_128 = local_58 + (long)pvVar59 * 4;
              lVar39 = local_60 + (long)pvVar59 * 4;
              local_210 = local_68 + (long)pvVar59 * 4;
              lVar45 = local_70 + (long)pvVar59 * 4;
              lVar49 = local_78 + (long)pvVar59 * 4;
              local_218 = lVar41 + (long)pvVar59 * 4;
              lVar57 = local_48 + lVar17 * 4;
              lVar60 = local_50 + lVar17 * 4;
              lVar33 = local_58 + lVar17 * 4;
              lVar62 = local_60 + lVar17 * 4;
              local_220 = local_68 + lVar17 * 4;
              local_228 = local_70 + lVar17 * 4;
              local_230 = local_78 + lVar17 * 4;
              local_250 = lVar41 + lVar17 * 4;
              local_140 = (void *)0x0;
              do {
                if (0 < (int)uVar37) {
                  lVar32 = 0;
                  do {
                    *puVar16 = *(undefined4 *)(local_250 + lVar32);
                    puVar16[1] = *(undefined4 *)(local_230 + lVar32);
                    puVar16[2] = *(undefined4 *)(local_228 + lVar32);
                    puVar16[3] = *(undefined4 *)(local_220 + lVar32);
                    puVar16[4] = *(undefined4 *)(lVar62 + lVar32);
                    puVar16[5] = *(undefined4 *)(lVar33 + lVar32);
                    puVar16[6] = *(undefined4 *)(lVar60 + lVar32);
                    puVar16[7] = *(undefined4 *)(lVar57 + lVar32);
                    puVar16[8] = *(undefined4 *)(local_218 + lVar32);
                    puVar16[9] = *(undefined4 *)(lVar49 + lVar32);
                    puVar16[10] = *(undefined4 *)(lVar45 + lVar32);
                    puVar16[0xb] = *(undefined4 *)(local_210 + lVar32);
                    puVar16[0xc] = *(undefined4 *)(lVar39 + lVar32);
                    puVar16[0xd] = *(undefined4 *)(local_128 + lVar32);
                    puVar16[0xe] = *(undefined4 *)(local_120 + lVar32);
                    puVar16[0xf] = *(undefined4 *)(local_260 + lVar32);
                    puVar16 = puVar16 + 0x10;
                    lVar32 = lVar32 + 4;
                  } while (uVar51 * 4 != lVar32);
                }
                pvVar47 = (void *)((long)local_140 + 8);
                lVar32 = (long)local_140 + 0xf;
                local_260 = local_260 + lVar30;
                local_120 = local_120 + lVar30;
                local_128 = local_128 + lVar30;
                lVar39 = lVar39 + lVar30;
                local_210 = local_210 + lVar30;
                lVar45 = lVar45 + lVar30;
                lVar49 = lVar49 + lVar30;
                local_218 = local_218 + lVar30;
                lVar57 = lVar57 + lVar30;
                lVar60 = lVar60 + lVar30;
                lVar33 = lVar33 + lVar30;
                lVar62 = lVar62 + lVar30;
                local_220 = local_220 + lVar30;
                local_228 = local_228 + lVar30;
                local_230 = local_230 + lVar30;
                local_250 = local_250 + lVar30;
                local_140 = pvVar47;
                local_138 = lVar17;
                local_130 = pvVar59;
              } while (lVar32 < lVar35);
            }
            pvVar59 = (void *)((long)pvVar59 * 4);
            lVar17 = lVar17 * 4;
            if ((int)((uint)pvVar47 | 3) < (int)num_input) {
              pvVar22 = (void *)((ulong)pvVar47 & 0xffffffff);
              lVar57 = lVar50 * (long)pvVar22;
              lVar39 = (long)pvVar59 + local_68 + lVar57;
              lVar45 = (long)pvVar59 + local_70 + lVar57;
              lVar62 = ((long)pvVar22 * 4 + 4) * local_148;
              lVar32 = (long)pvVar59 + lVar62 + lVar41;
              lVar60 = (long)pvVar59 + lVar41 + lVar57;
              lVar57 = lVar57 + lVar17;
              lVar33 = local_68 + lVar57;
              lVar62 = lVar62 + lVar17 + lVar41;
              lVar49 = local_70 + lVar57;
              lVar57 = lVar57 + lVar41;
              do {
                if (0 < (int)uVar37) {
                  lVar18 = 0;
                  puVar55 = puVar16;
                  do {
                    puVar23 = puVar55;
                    puVar55 = puVar16 + lVar18 * 2;
                    *puVar55 = *(undefined4 *)(lVar57 + lVar18);
                    puVar55[1] = *(undefined4 *)(lVar62 + lVar18);
                    puVar55[2] = *(undefined4 *)(lVar49 + lVar18);
                    puVar55[3] = *(undefined4 *)(lVar33 + lVar18);
                    puVar55[4] = *(undefined4 *)(lVar60 + lVar18);
                    puVar55[5] = *(undefined4 *)(lVar32 + lVar18);
                    puVar55[6] = *(undefined4 *)(lVar45 + lVar18);
                    puVar55[7] = *(undefined4 *)(lVar39 + lVar18);
                    lVar18 = lVar18 + 4;
                    puVar55 = puVar55 + 8;
                  } while (uVar51 * 4 != lVar18);
                  puVar16 = puVar23 + 8;
                }
                pvVar47 = (void *)((long)pvVar22 + 4);
                lVar18 = (long)pvVar22 + 7;
                lVar39 = lVar39 + lVar31;
                lVar45 = lVar45 + lVar31;
                lVar32 = lVar32 + lVar31;
                lVar60 = lVar60 + lVar31;
                lVar33 = lVar33 + lVar31;
                lVar49 = lVar49 + lVar31;
                lVar62 = lVar62 + lVar31;
                lVar57 = lVar57 + lVar31;
                pvVar22 = pvVar47;
                local_138 = lVar17;
                local_130 = pvVar59;
              } while (lVar18 < lVar35);
            }
            if ((int)((uint)pvVar47 | 1) < (int)num_input) {
              lVar39 = lVar50 * (long)((ulong)pvVar47 & 0xffffffff);
              lVar45 = (long)pvVar59 + lVar41 + lVar39;
              lVar39 = lVar39 + lVar17 + lVar41;
              pvVar22 = (void *)((ulong)pvVar47 & 0xffffffff);
              do {
                if (0 < (int)uVar37) {
                  uVar52 = 0;
                  lVar49 = lVar39;
                  lVar57 = lVar45;
                  do {
                    lVar60 = 0;
                    bVar9 = true;
                    do {
                      bVar10 = bVar9;
                      *puVar16 = *(undefined4 *)(lVar49 + lVar60);
                      puVar16[1] = *(undefined4 *)(lVar57 + lVar60);
                      puVar16 = puVar16 + 2;
                      lVar60 = lVar60 + lVar50;
                      bVar9 = false;
                    } while (bVar10);
                    uVar52 = uVar52 + 1;
                    lVar57 = lVar57 + 4;
                    lVar49 = lVar49 + 4;
                  } while (uVar52 != uVar51);
                }
                pvVar47 = (void *)((long)pvVar22 + 2);
                lVar49 = (long)pvVar22 + 3;
                lVar45 = lVar45 + local_148 * 8;
                lVar39 = lVar39 + local_148 * 8;
                pvVar22 = pvVar47;
              } while (lVar49 < lVar35);
            }
            if ((int)pvVar47 < (int)num_input) {
              lVar39 = (long)(int)pvVar47;
              lVar45 = (long)pvVar59 + lVar41 + lVar50 * lVar39;
              lVar17 = lVar50 * lVar39 + lVar17 + lVar41;
              do {
                if (0 < (int)uVar37) {
                  uVar52 = 0;
                  do {
                    *puVar16 = *(undefined4 *)(lVar17 + uVar52 * 4);
                    puVar16[1] = *(undefined4 *)(lVar45 + uVar52 * 4);
                    puVar16 = puVar16 + 2;
                    uVar52 = uVar52 + 1;
                  } while (uVar51 != uVar52);
                }
                lVar39 = lVar39 + 1;
                lVar45 = lVar45 + lVar50;
                lVar17 = lVar17 + lVar50;
              } while (lVar39 != lVar35);
            }
            uVar52 = uVar63 + 2;
            lVar17 = uVar63 + 3;
            iVar56 = iVar56 + local_7c;
            iVar20 = iVar20 + local_7c;
            uVar63 = uVar52;
          } while (lVar17 < (long)uVar38);
        }
        iVar56 = (int)uVar52;
        if (iVar56 < (int)uVar36) {
          lVar41 = *(long *)((long)&(this->weight_winograd63_data).dims + (long)p_Var34);
          sVar2 = (this->weight_data_tm).elemsize;
          sVar3 = (this->weight_data_tm).cstep;
          pvVar59 = (this->weight_data_tm).data;
          uVar52 = (ulong)iVar56;
          iVar56 = iVar56 * uVar37 * num_input;
          lVar50 = local_148 * 4;
          do {
            puVar16 = (undefined4 *)
                      ((ulong)(((uint)uVar52 & 1) + ((uint)(uVar52 >> 3) & 0x1fffffff) +
                               ((uint)(uVar52 >> 2) & 1) + (uint)(((uint)uVar52 >> 1 & 1) != 0)) *
                       sVar2 * sVar3 + (long)pvVar59);
            if ((int)num_input < 8) {
              uVar63 = 0;
            }
            else {
              puVar55 = (undefined4 *)(lVar41 + (long)iVar56 * 4);
              uVar53 = 0;
              do {
                if (0 < (int)uVar37) {
                  uVar63 = 0;
                  puVar23 = puVar55;
                  do {
                    puVar27 = puVar16;
                    lVar31 = 0;
                    puVar16 = puVar23;
                    do {
                      *(undefined4 *)((long)puVar27 + lVar31) = *puVar16;
                      lVar31 = lVar31 + 4;
                      puVar16 = puVar16 + local_148;
                    } while ((int)lVar31 != 0x20);
                    uVar63 = uVar63 + 1;
                    puVar23 = puVar23 + 1;
                    puVar16 = (undefined4 *)((long)puVar27 + lVar31);
                  } while (uVar63 != uVar51);
                  puVar16 = (undefined4 *)((long)puVar27 + lVar31);
                }
                uVar63 = uVar53 + 8;
                lVar31 = uVar53 + 0xf;
                puVar55 = puVar55 + uVar51 * 8;
                uVar53 = uVar63;
              } while (lVar31 < lVar35);
            }
            lVar31 = (long)iVar56 * 4;
            if ((int)((uint)uVar63 | 3) < (int)num_input) {
              puVar55 = (undefined4 *)(lVar50 * (uVar63 & 0xffffffff) + lVar31 + lVar41);
              uVar53 = uVar63 & 0xffffffff;
              do {
                if (0 < (int)uVar37) {
                  uVar63 = 0;
                  puVar23 = puVar55;
                  do {
                    puVar27 = puVar16;
                    lVar30 = 0;
                    puVar16 = puVar23;
                    do {
                      *(undefined4 *)((long)puVar27 + lVar30) = *puVar16;
                      lVar30 = lVar30 + 4;
                      puVar16 = puVar16 + local_148;
                    } while ((int)lVar30 != 0x10);
                    uVar63 = uVar63 + 1;
                    puVar23 = puVar23 + 1;
                    puVar16 = (undefined4 *)((long)puVar27 + lVar30);
                  } while (uVar63 != uVar51);
                  puVar16 = (undefined4 *)((long)puVar27 + lVar30);
                }
                uVar63 = uVar53 + 4;
                lVar30 = uVar53 + 7;
                puVar55 = puVar55 + local_148 * 4;
                uVar53 = uVar63;
              } while (lVar30 < lVar35);
            }
            if ((int)((uint)uVar63 | 1) < (int)num_input) {
              uVar53 = uVar63 & 0xffffffff;
              lVar17 = (uVar53 * 4 + 4) * local_148 + lVar41 + lVar31;
              lVar30 = lVar50 * uVar53 + lVar31 + lVar41;
              do {
                if (0 < (int)uVar37) {
                  uVar63 = 0;
                  do {
                    *puVar16 = *(undefined4 *)(lVar30 + uVar63 * 4);
                    puVar16[1] = *(undefined4 *)(lVar17 + uVar63 * 4);
                    puVar16 = puVar16 + 2;
                    uVar63 = uVar63 + 1;
                  } while (uVar51 != uVar63);
                }
                uVar63 = uVar53 + 2;
                lVar39 = uVar53 + 3;
                lVar17 = lVar17 + local_148 * 8;
                lVar30 = lVar30 + local_148 * 8;
                uVar53 = uVar63;
              } while (lVar39 < lVar35);
            }
            if ((int)uVar63 < (int)num_input) {
              lVar30 = (long)(int)uVar63;
              lVar31 = lVar50 * lVar30 + lVar31 + lVar41;
              do {
                if (0 < (int)uVar37) {
                  lVar17 = 0;
                  do {
                    *(undefined4 *)((long)puVar16 + lVar17) = *(undefined4 *)(lVar31 + lVar17);
                    lVar17 = lVar17 + 4;
                  } while (uVar51 * 4 - lVar17 != 0);
                  puVar16 = (undefined4 *)((long)puVar16 + lVar17);
                }
                lVar30 = lVar30 + 1;
                lVar31 = lVar31 + lVar50;
              } while (lVar30 != lVar35);
            }
            uVar52 = uVar52 + 1;
            iVar56 = iVar56 + uVar37 * num_input;
          } while (uVar52 != uVar38);
        }
      }
      else {
        auVar6 = vpshufd_avx(auVar6,0x44);
        auVar6 = vpinsrd_avx(auVar6,elempack,0);
        auVar64 = vpinsrd_avx(auVar6,iVar56,1);
        auVar65 = vpmovsxbd_avx(ZEXT416(0x1030301));
        auVar6 = vpcmpeqd_avx(auVar64,auVar65);
        bVar8 = auVar6[0];
        if ((auVar64 != auVar65) || ((iVar40 != 1 || (iVar44 != 8)))) goto LAB_001fdace;
        if (iVar24 == 2) {
          if (iVar20 != 2) goto LAB_001fdacb;
        }
        else if ((iVar24 != 1) || (iVar20 != 1)) {
LAB_001fdacb:
          bVar9 = false;
          bVar8 = 1;
          goto LAB_001fdace;
        }
LAB_001fdaf9:
        convolution_transform_kernel_packed_sse
                  ((Mat *)((long)&(this->weight_winograd63_data).dims + (long)p_Var34),
                   &this->weight_data_tm,num_input,uVar36,iVar56,kernel_h,elempack,iVar44);
      }
    }
    if (opt->lightmode != true) {
      return 0;
    }
    p_Var4 = this->_vptr_Convolution_x86_fma[-3];
    p_Var34 = (_func_int *)((long)&this->_vptr_Convolution_x86_fma + (long)p_Var4);
    pauVar61 = (undefined1 (*) [16])((long)&(this->weight_winograd63_data).dims + (long)p_Var4);
    piVar1 = *(int **)((long)&(this->weight_winograd63_data).h + (long)p_Var4);
    if (piVar1 == (int *)0x0) goto LAB_001ff842;
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 != 0) goto LAB_001ff842;
    pvVar59 = *(void **)(p_Var34 + 0x160);
    plVar5 = *(long **)(p_Var34 + 0x180);
  }
  else {
    if (((((iVar20 != 3) || (iVar56 != 3)) || (opt->use_winograd_convolution == false)) ||
        (((int)uVar36 < 9 && (int)num_input < 9 ||
         (*(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var34) != 1)))) ||
       ((*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var34) != 1 ||
        ((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var34) != 1 ||
         (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var34) != 1))))))
    goto LAB_001fd20f;
    lVar35 = *(long *)((long)&(this->weight_sgemm_data).cstep + (long)p_Var34);
    if ((lVar35 == *(long *)((long)&(this->weight_winograd23_data).data + (long)p_Var34)) ||
       ((*(int *)(lVar35 + 0x2c) == 0 || (*(int *)(lVar35 + 0x30) == 0)))) {
      lVar50 = *(long *)((long)&(this->weight_winograd23_data).elemsize + (long)p_Var34);
      lVar41 = *(long *)((long)&(this->weight_winograd23_data).elempack + (long)p_Var34);
      if ((lVar50 != lVar41) && ((*(int *)(lVar50 + 0x2c) != 0 && (*(int *)(lVar50 + 0x30) != 0))))
      goto LAB_001fda94;
      if ((0x20 < (int)uVar36) ||
         ((opt->use_winograd63_convolution == false || (0x20 < (int)num_input)))) {
        pMVar54 = (Mat *)((long)&(this->weight_winograd63_data).dims + (long)p_Var34);
        if (opt->use_winograd43_convolution == true) {
          conv3x3s1_winograd43_transform_kernel
                    (pMVar54,&this->weight_winograd43_data,num_input,uVar36,opt);
        }
        else {
          conv3x3s1_winograd23_transform_kernel
                    (pMVar54,&this->weight_winograd23_data,num_input,uVar36,opt);
        }
        goto LAB_001ff925;
      }
LAB_001fe5a2:
      conv3x3s1_winograd63_transform_kernel
                ((Mat *)((long)&(this->weight_winograd63_data).dims + (long)p_Var34),
                 &this->weight_winograd63_data,num_input,uVar36,opt);
    }
    else {
      lVar50 = *(long *)((long)&(this->weight_winograd23_data).elemsize + (long)p_Var34);
      lVar41 = *(long *)((long)&(this->weight_winograd23_data).elempack + (long)p_Var34);
LAB_001fda94:
      if (((lVar50 == lVar41) || (*(int *)(lVar50 + 0x2c) == 0)) || (*(int *)(lVar50 + 0x30) == 0))
      {
        iVar56 = *(int *)(lVar35 + 0x2c);
        iVar20 = *(int *)(lVar35 + 0x30);
        uVar38 = *(ulong *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var34 + 4));
        auVar64._8_8_ = 0;
        auVar64._0_8_ = uVar38;
        auVar6 = vpcmpgtd_avx(auVar64,(undefined1  [16])0x0);
        auVar6 = vpmovsxdq_avx(auVar6);
        if ((((auVar6 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0 && -1 < auVar6[0xf])
            && (iVar44 = *(int *)((long)&(this->weight_winograd43_data).data + (long)(p_Var34 + 4)),
               iVar44 < 1)) &&
           (iVar12 = *(int *)((long)&(this->weight_winograd43_data).refcount + (long)p_Var34),
           iVar12 < 1)) {
          auVar6 = vpinsrd_avx(auVar64,iVar44,2);
          auVar6 = vpinsrd_avx(auVar6,iVar12,3);
          auVar65._8_4_ = 0xffffff17;
          auVar65._0_8_ = 0xffffff17ffffff17;
          auVar65._12_4_ = 0xffffff17;
          if (auVar6 != auVar65) {
            auVar66._8_4_ = 0xffffff16;
            auVar66._0_8_ = 0xffffff16ffffff16;
            auVar66._12_4_ = 0xffffff16;
            auVar6 = vpcmpeqd_avx(auVar6,auVar66);
            uVar13 = vmovmskps_avx(auVar6);
            if ((char)uVar13 != '\x0f') goto LAB_001fe6bf;
          }
          iVar56 = iVar56 + 2;
          iVar20 = iVar20 + 2;
        }
        else {
          iVar56 = iVar56 + (int)(uVar38 >> 0x20) + (int)uVar38;
          iVar20 = iVar20 + *(int *)((long)&(this->weight_winograd43_data).data +
                                    (long)(p_Var34 + 4)) +
                   *(int *)((long)&(this->weight_winograd43_data).refcount + (long)p_Var34);
        }
      }
      else {
        iVar56 = *(int *)(lVar50 + 0x2c) + 2;
        iVar20 = *(int *)(lVar50 + 0x30) + 2;
      }
LAB_001fe6bf:
      bVar9 = test_prefer_winograd63(num_input,uVar36,iVar56,iVar20);
      bVar10 = test_prefer_winograd23(num_input,uVar36,iVar56,iVar20);
      bVar19 = bVar10 & bVar8;
      if (!bVar10) {
        bVar8 = bVar9;
      }
      if (bVar9) {
        bVar11 = opt->use_winograd63_convolution;
        if ((bVar8 & bVar11) == 0) goto LAB_001ff8be;
LAB_001fe82d:
        if (bVar19 == 0) {
          if (bVar9) goto LAB_001fe5a2;
          goto LAB_001ff925;
        }
      }
      else {
        if (bVar8 != 0) goto LAB_001fe82d;
        bVar11 = 0;
LAB_001ff8be:
        if (opt->use_winograd43_convolution != false) {
          if (bVar19 != 0) goto LAB_001ff8fe;
          conv3x3s1_winograd43_transform_kernel
                    ((Mat *)((long)&(this->weight_winograd63_data).dims + (long)p_Var34),
                     &this->weight_winograd43_data,num_input,uVar36,opt);
          goto LAB_001ff925;
        }
        if (bVar19 == 0 && opt->use_winograd63_convolution == true) {
          if (bVar11 != 0 || opt->use_winograd63_convolution != false) goto LAB_001fe5a2;
          goto LAB_001ff925;
        }
      }
LAB_001ff8fe:
      conv3x3s1_winograd23_transform_kernel
                ((Mat *)((long)&(this->weight_winograd63_data).dims + (long)p_Var34),
                 &this->weight_winograd23_data,num_input,uVar36,opt);
    }
LAB_001ff925:
    if (opt->lightmode != true) {
      return 0;
    }
    p_Var4 = this->_vptr_Convolution_x86_fma[-3];
    p_Var34 = (_func_int *)((long)&this->_vptr_Convolution_x86_fma + (long)p_Var4);
    pauVar61 = (undefined1 (*) [16])((long)&(this->weight_winograd63_data).dims + (long)p_Var4);
    piVar1 = *(int **)((long)&(this->weight_winograd63_data).h + (long)p_Var4);
    if (piVar1 == (int *)0x0) goto LAB_001ff842;
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 != 0) goto LAB_001ff842;
    pvVar59 = *(void **)(p_Var34 + 0x160);
    plVar5 = *(long **)(p_Var34 + 0x180);
  }
  if (plVar5 == (long *)0x0) {
    if (pvVar59 != (void *)0x0) {
      free(pvVar59);
    }
  }
  else {
    (**(code **)(*plVar5 + 0x18))();
  }
LAB_001ff842:
  *(undefined8 *)(p_Var34 + 0x1a0) = 0;
  *(undefined1 (*) [16])(*pauVar61 + 0xc) = (undefined1  [16])0x0;
  *pauVar61 = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(p_Var34 + 0x188) = (undefined1  [16])0x0;
  *(undefined4 *)(p_Var34 + 0x198) = 0;
  return 0;
}

Assistant:

int Convolution_x86_fma::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    activation = create_activation_layer(activation_type, activation_params, opt);
    nT = opt.num_threads;

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

    int kernel_size = kernel_w * kernel_h;
    int num_input = weight_data_size / kernel_size / num_output;

    if (!opt.use_packing_layout && kernel_w == kernel_h && dilation_w != 1 && dilation_h == dilation_w && stride_w == 1 && stride_h == 1)
    {
        convolution_dilation1 = ncnn::create_layer(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output); // num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, 1);
        pd.set(12, 1);
        pd.set(3, 1);  // stride_w
        pd.set(13, 1); // stride_h
        pd.set(4, 0);  // pad_w
        pd.set(14, 0); // pad_h
        pd.set(5, bias_term);
        pd.set(6, weight_data_size);

        convolution_dilation1->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[2];
            weights[0] = weight_data;
            weights[1] = bias_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[1];
            weights[0] = weight_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }

        convolution_dilation1->create_pipeline(opt);

        if (opt.lightmode)
        {
            weight_data.release();
        }

        return 0;
    }

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        elempack = num_input % 16 == 0 ? 16 : num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    bool prefer_winograd = (opt.use_winograd23_convolution || opt.use_winograd43_convolution || opt.use_winograd63_convolution) && (num_input > 8 || num_output > 8);

    if (opt.use_winograd_convolution && prefer_winograd && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
        if ((bottom_shapes.empty() || bottom_shapes[0].w == 0 || bottom_shapes[0].h == 0) && (top_shapes.empty() || top_shapes[0].w == 0 || top_shapes[0].h == 0))
        {
            // dynamic shape
            if ((opt.use_winograd63_convolution) && (num_input <= 32 && num_output <= 32))
                conv3x3s1_winograd63_transform_kernel(weight_data, weight_winograd63_data, num_input, num_output, opt);
            else if (opt.use_winograd43_convolution)
                conv3x3s1_winograd43_transform_kernel(weight_data, weight_winograd43_data, num_input, num_output, opt);
            else
                conv3x3s1_winograd23_transform_kernel(weight_data, weight_winograd23_data, num_input, num_output, opt);
        }
        else
        {
            int w;
            int h;
            if (top_shapes.empty() || top_shapes[0].w == 0 || top_shapes[0].h == 0)
            {
                w = bottom_shapes[0].w;
                h = bottom_shapes[0].h;

                // make padding
                if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0)
                {
                    w += pad_left + pad_right;
                    h += pad_top + pad_bottom;
                }
                else if ((pad_left == -233 && pad_right == -233 && pad_top == -233 && pad_bottom == -233)
                         || (pad_left == -234 && pad_right == -234 && pad_top == -234 && pad_bottom == -234))
                {
                    // tensorflow padding=SAME or onnx padding=SAME_UPPER/SAME_LOWER
                    w += 2;
                    h += 2;
                }
            }
            else
            {
                w = top_shapes[0].w + 2;
                h = top_shapes[0].h + 2;
            }

            bool prefer_winograd63 = test_prefer_winograd63(num_input, num_output, w, h);
            bool prefer_winograd23 = test_prefer_winograd23(num_input, num_output, w, h);
            bool prefer_winograd43 = !prefer_winograd63 && !prefer_winograd23;

            if (prefer_winograd23 && !opt.use_winograd23_convolution)
            {
                // f23 fallback to f43
                prefer_winograd23 = false;
                prefer_winograd43 = true;
            }

            if (prefer_winograd63 && !opt.use_winograd63_convolution)
            {
                // f63 fallback to f43
                prefer_winograd63 = false;
                prefer_winograd43 = true;
            }

            if (prefer_winograd43 && !opt.use_winograd43_convolution)
            {
                // f43 fallback to f63 or f23
                prefer_winograd43 = false;
                if (opt.use_winograd63_convolution)
                {
                    prefer_winograd63 = true;
                }
                else
                {
                    prefer_winograd23 = true;
                }
            }

            if (prefer_winograd23)
            {
                conv3x3s1_winograd23_transform_kernel(weight_data, weight_winograd23_data, num_input, num_output, opt);
            }
            else if (prefer_winograd43)
            {
                conv3x3s1_winograd43_transform_kernel(weight_data, weight_winograd43_data, num_input, num_output, opt);
            }
            else if (prefer_winograd63)
            {
                conv3x3s1_winograd63_transform_kernel(weight_data, weight_winograd63_data, num_input, num_output, opt);
            }
            else
            {
                // should never reach here
            }
        }

        if (opt.lightmode)
        {
            weight_data.release();
        }

        return 0;
    }

    int l2_cache_size = get_cpu_level2_cache_size();
    bool prefer_sgemm = num_input * num_output * kernel_w * kernel_h * dilation_w * dilation_h * stride_w * stride_h * (int)sizeof(float) * 2 > l2_cache_size || (num_input > 16 || num_output > 16);

    if ((opt.use_sgemm_convolution && prefer_sgemm) || (kernel_w == 1 && kernel_h == 1))
    {
        const int maxk = kernel_w * kernel_h;

        gemm = ncnn::create_layer(ncnn::LayerType::Gemm);

        ncnn::ParamDict pd;
        pd.set(2, 0);                   // transA
        pd.set(3, 0);                   // transB
        pd.set(4, 1);                   // constantA
        pd.set(5, 0);                   // constantB
        pd.set(6, 1);                   // constantC
        pd.set(7, num_output);          // M = outch
        pd.set(8, 0);                   // N = size
        pd.set(9, maxk * num_input);    // K = maxk*inch
        pd.set(10, bias_term ? 1 : -1); // constant_broadcast_type_C = (M)
        pd.set(11, 1);                  // output_N1M

        gemm->load_param(pd);

        // maxk-inch-outch to pa-maxk-inch/pa-outch
        Mat tmp;
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, num_input, num_output);

            tmp.create(maxk * num_input, num_output);

            for (int q = 0; q < num_output; q += 1)
            {
                float* g00 = tmp.row(q);

                for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
                {
                    for (int k = 0; k < maxk; k++)
                    {
                        for (int i = 0; i < elempack; i++)
                        {
                            const float* k00 = weight_data_r2.channel(q).row(p + i);
                            g00[0] = k00[k];
                            g00++;
                        }
                    }
                }
            }
        }

        if (bias_term)
        {
            ncnn::Mat weights[2];
            weights[0] = tmp;
            weights[1] = bias_data;

            gemm->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[1];
            weights[0] = tmp;

            gemm->load_model(ModelBinFromMatArray(weights));
        }

        gemm->create_pipeline(opt);
    }
    else
    {
        if ((elempack == 16 && out_elempack == 1 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
                || (elempack == 8 && out_elempack == 8 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
                || (elempack == 8 && out_elempack == 8 && kernel_w == 2 && kernel_h == 2 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
                || (elempack == 1 && out_elempack == 8 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
                || (elempack == 1 && out_elempack == 8 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
                || (elempack == 8 && out_elempack == 1 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
                || (elempack == 1 && out_elempack == 4 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
                || (elempack == 1 && out_elempack == 4 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2))
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else
        {
            convolution_transform_kernel_packed(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h);
        }
    }

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}